

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O2

bool __thiscall QPDF::isLinearized(QPDF *this)

{
  long *plVar1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  bool bVar3;
  int iVar4;
  longlong lVar5;
  long lVar6;
  double __x;
  uint local_1d4;
  allocator<char> local_1c1;
  size_t pos;
  QPDFObjectHandle L;
  QPDFObjectHandle candidate;
  QPDFObjectHandle linkey;
  string buffer;
  double local_100;
  char *local_f8;
  Token t1;
  
  InputSource::read_abi_cxx11_
            ((InputSource *)&buffer,
             (int)(((this->m)._M_t.
                    super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                    super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                    super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                  super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,(void *)0x400,0
            );
  pos = 0;
  local_1d4 = (uint)&pos;
  do {
    t1.type = tt_string;
    t1._4_4_ = 0;
    t1.value._M_dataplus._M_p = "0123456789";
    pos = std::__cxx11::string::find_first_of<std::basic_string_view<char,std::char_traits<char>>>
                    ((string *)&buffer,(basic_string_view<char,_std::char_traits<char>_> *)&t1,pos);
    if (pos == 0xffffffffffffffff) {
      local_1d4._0_1_ = false;
      break;
    }
    plVar1 = *(long **)&(((this->m)._M_t.
                          super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                          .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                        super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
    lVar5 = QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::convert(&pos);
    (**(code **)(*plVar1 + 0x28))(plVar1,lVar5,0);
    readToken(&t1,this,(((this->m)._M_t.
                         super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                         .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                       super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0x14);
    if (t1.type == tt_integer) {
      readToken((Token *)&local_100,this,
                (((this->m)._M_t.
                  super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,6);
      if (local_100._0_4_ != tt_integer) {
        QPDFTokenizer::Token::~Token((Token *)&local_100);
        goto LAB_001d4702;
      }
      readToken((Token *)&candidate,this,
                (((this->m)._M_t.
                  super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,4);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&linkey,"obj",(allocator<char> *)&L);
      bVar3 = QPDFTokenizer::Token::isWord((Token *)&candidate,(string *)&linkey);
      std::__cxx11::string::~string((string *)&linkey);
      QPDFTokenizer::Token::~Token((Token *)&candidate);
      QPDFTokenizer::Token::~Token((Token *)&local_100);
      if (!bVar3) goto LAB_001d4702;
      local_100 = (double)QUtil::string_to_ll(t1.value._M_dataplus._M_p);
      iVar4 = QIntC::IntConverter<long_long,_int,_true,_true>::convert((longlong *)&local_100);
      getObject((QPDF *)&candidate,(int)this,iVar4);
      bVar3 = QPDFObjectHandle::isDictionary(&candidate);
      if (bVar3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_100,"/Linearized",(allocator<char> *)&L);
        QPDFObjectHandle::getKey(&linkey,(string *)&candidate);
        std::__cxx11::string::~string((string *)&local_100);
        bVar3 = QPDFObjectHandle::isNumber(&linkey);
        if (bVar3) {
          __x = QPDFObjectHandle::getNumericValue(&linkey);
          local_100 = floor(__x);
          iVar4 = QIntC::IntConverter<double,_int,_true,_true>::convert(&local_100);
          if (iVar4 != 1) goto LAB_001d4762;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"/L",&local_1c1);
          QPDFObjectHandle::getKey(&L,(string *)&candidate);
          std::__cxx11::string::~string((string *)&local_100);
          bVar3 = QPDFObjectHandle::isInteger(&L);
          if (bVar3) {
            lVar5 = QPDFObjectHandle::getIntValue(&L);
            plVar1 = *(long **)&(((this->m)._M_t.
                                  super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                  .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file
                                ).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
            (**(code **)(*plVar1 + 0x28))(plVar1,0,2);
            lVar6 = (**(code **)(**(long **)&(((this->m)._M_t.
                                               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                               .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                              _M_head_impl)->file).
                                             super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                                + 0x20))();
            if (lVar5 != lVar6) goto LAB_001d476c;
            _Var2._M_head_impl =
                 (this->m)._M_t.
                 super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                 super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                 super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
            ((_Var2._M_head_impl)->linp).file_size = lVar5;
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                       &(_Var2._M_head_impl)->lindict,
                       (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&candidate);
            local_1d4 = 1;
          }
          else {
LAB_001d476c:
            local_1d4 = 0;
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&L.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        }
        else {
LAB_001d4762:
          local_1d4 = 0;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&linkey.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      else {
        local_1d4 = 0;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&candidate.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      bVar3 = false;
    }
    else {
LAB_001d4702:
      local_100 = 4.94065645841247e-323;
      local_f8 = "0123456789";
      pos = std::__cxx11::string::
            find_first_not_of<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)&buffer,
                       (basic_string_view<char,_std::char_traits<char>_> *)&local_100,pos);
      bVar3 = pos != 0xffffffffffffffff;
      local_1d4 = (uint)((byte)local_1d4 & bVar3);
    }
    QPDFTokenizer::Token::~Token(&t1);
  } while (bVar3);
  std::__cxx11::string::~string((string *)&buffer);
  return local_1d4._0_1_;
}

Assistant:

bool
QPDF::isLinearized()
{
    // If the first object in the file is a dictionary with a suitable /Linearized key and has an /L
    // key that accurately indicates the file size, initialize m->lindict and return true.

    // A linearized PDF spec's first object will be contained within the first 1024 bytes of the
    // file and will be a dictionary with a valid /Linearized key.  This routine looks for that and
    // does no additional validation.

    // The PDF spec says the linearization dictionary must be completely contained within the first
    // 1024 bytes of the file. Add a byte for a null terminator.
    auto buffer = m->file->read(1024, 0);
    size_t pos = 0;
    while (true) {
        // Find a digit or end of buffer
        pos = buffer.find_first_of("0123456789"sv, pos);
        if (pos == std::string::npos) {
            return false;
        }
        // Seek to the digit. Then skip over digits for a potential
        // next iteration.
        m->file->seek(toO(pos), SEEK_SET);

        auto t1 = readToken(*m->file, 20);
        if (!(t1.isInteger() && readToken(*m->file, 6).isInteger() &&
              readToken(*m->file, 4).isWord("obj"))) {
            pos = buffer.find_first_not_of("0123456789"sv, pos);
            if (pos == std::string::npos) {
                return false;
            }
            continue;
        }

        auto candidate = getObject(toI(QUtil::string_to_ll(t1.getValue().data())), 0);
        if (!candidate.isDictionary()) {
            return false;
        }

        auto linkey = candidate.getKey("/Linearized");
        if (!(linkey.isNumber() && toI(floor(linkey.getNumericValue())) == 1)) {
            return false;
        }

        auto L = candidate.getKey("/L");
        if (!L.isInteger()) {
            return false;
        }
        qpdf_offset_t Li = L.getIntValue();
        m->file->seek(0, SEEK_END);
        if (Li != m->file->tell()) {
            QTC::TC("qpdf", "QPDF /L mismatch");
            return false;
        }
        m->linp.file_size = Li;
        m->lindict = candidate;
        return true;
    }
}